

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createPrimitiveDiscardTests(TestContext *testCtx)

{
  TestContext *testCtx_00;
  TestCaseGroup *pTVar1;
  TestNode *node;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  char *__rhs;
  char *__rhs_00;
  ulong uVar7;
  ulong local_178;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string caseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"primitive_discard",
             "Test primitive discard with relevant outer tessellation level <= 0.0");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  for (uVar3 = 0;
      pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, uVar3 != 3; uVar3 = uVar3 + 1) {
    for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
      for (uVar2 = 0; uVar2 != 2; uVar2 = uVar2 + 1) {
        __rhs = (char *)0x0;
        if (uVar2 == 1) {
          __rhs = "cw";
        }
        if (uVar2 == 0) {
          __rhs = "ccw";
        }
        for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
          __rhs_00 = "";
          if ((uVar5 & 1) != 0) {
            __rhs_00 = "_point_mode";
          }
          local_178 = 0;
          uVar7 = 0;
          while( true ) {
            if (uVar7 == 2) break;
            if ((((uVar6 == 1 && uVar3 != 2) & (byte)uVar5) != 0) || ((uVar7 & 1) != 0)) {
              local_130._M_string_length = 0;
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              local_130.field_2._M_local_buf[0] = '\0';
              if (uVar3 < 3) {
                pcVar4 = (char *)(&DAT_00bdb4f0)[uVar3];
              }
              else {
                pcVar4 = (char *)0x0;
              }
              std::operator+(&local_70,&local_130,pcVar4);
              std::operator+(&local_f0,&local_70,"_");
              if (uVar6 < 3) {
                pcVar4 = (&PTR_anon_var_dwarf_fa11a3_00bdb508)[uVar6];
              }
              else {
                pcVar4 = (char *)0x0;
              }
              std::operator+(&local_b0,&local_f0,pcVar4);
              std::operator+(&local_50,&local_b0,"_");
              std::operator+(&local_90,&local_50,__rhs);
              std::operator+(&local_110,&local_90,__rhs_00);
              pcVar4 = "_valid_levels";
              if ((uVar7 & 1) != 0) {
                pcVar4 = "";
              }
              std::operator+(&caseName,&local_110,pcVar4);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_130);
              pTVar1 = group.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.ptr;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,"",(allocator<char> *)&local_90);
              testCtx_00 = (pTVar1->super_TestNode).m_testCtx;
              node = (TestNode *)operator_new(0x90);
              TestCase::TestCase((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,&caseName,
                                 &local_110);
              node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bdb460;
              node[1]._vptr_TestNode = (_func_int **)anon_unknown_0::initPrograms;
              node[1].m_testCtx = (TestContext *)anon_unknown_0::test;
              node[1].m_name._M_dataplus._M_p = (pointer)(uVar6 << 0x20 | uVar3);
              node[1].m_name._M_string_length = uVar5 << 0x20 | local_178 | uVar2;
              tcu::TestNode::addChild(&pTVar1->super_TestNode,node);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&caseName);
            }
            uVar7 = uVar7 + 1;
            local_178 = local_178 + 0x10000000000;
          }
        }
      }
    }
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createPrimitiveDiscardTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "primitive_discard", "Test primitive discard with relevant outer tessellation level <= 0.0"));

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; primitiveTypeNdx++)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; spacingModeNdx++)
	for (int windingNdx = 0; windingNdx < WINDING_LAST; windingNdx++)
	for (int usePointModeNdx = 0; usePointModeNdx <= 1; usePointModeNdx++)
	for (int lessThanOneInnerLevelsNdx = 0; lessThanOneInnerLevelsNdx <= 1; lessThanOneInnerLevelsNdx++)
	{
		const CaseDefinition caseDef =
		{
			(TessPrimitiveType)primitiveTypeNdx,
			(SpacingMode)spacingModeNdx,
			(Winding)windingNdx,
			(usePointModeNdx != 0),
			(lessThanOneInnerLevelsNdx != 0)
		};

		if (lessThanOneInnerLevelsDefined(caseDef) && !caseDef.useLessThanOneInnerLevels)
			continue; // No point generating a separate case as <= 1 inner level behavior is well-defined

		const std::string caseName = std::string() + getTessPrimitiveTypeShaderName(caseDef.primitiveType)
									 + "_" + getSpacingModeShaderName(caseDef.spacingMode)
									 + "_" + getWindingShaderName(caseDef.winding)
									 + (caseDef.usePointMode ? "_point_mode" : "")
									 + (caseDef.useLessThanOneInnerLevels ? "" : "_valid_levels");

		addFunctionCaseWithPrograms(group.get(), caseName, "", initPrograms, test, caseDef);
	}

	return group.release();
}